

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_GIF.cpp
# Opt level: O2

int __thiscall Am_GIF_Image::load_gif_colormap(Am_GIF_Image *this,ifstream *ifs,int flags)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Am_RGB_Value *pAVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  uchar buf [3];
  
  iVar5 = 2 << ((byte)flags & 7);
  (this->super_Am_Generic_Image).iminfo.num_colors = iVar5;
  pAVar3 = (this->super_Am_Generic_Image).color_map;
  if (pAVar3 != (Am_RGB_Value *)0x0) {
    operator_delete__(pAVar3);
    iVar5 = (this->super_Am_Generic_Image).iminfo.num_colors;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar5;
  uVar2 = SUB168(auVar1 * ZEXT816(6),0);
  uVar6 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(6),8) == 0) {
    uVar6 = uVar2;
  }
  pAVar3 = (Am_RGB_Value *)operator_new__(uVar6);
  if (iVar5 != 0) {
    uVar2 = uVar2 - 6;
    memset(pAVar3,0,(uVar2 - uVar2 % 6) + 6);
  }
  (this->super_Am_Generic_Image).color_map = pAVar3;
  lVar7 = 4;
  for (lVar4 = 0; lVar4 < iVar5; lVar4 = lVar4 + 1) {
    std::istream::read((char *)ifs,(long)buf);
    pAVar3 = (this->super_Am_Generic_Image).color_map;
    *(ushort *)((long)pAVar3 + lVar7 + -4) = (ushort)buf[0];
    *(ushort *)((long)pAVar3 + lVar7 + -2) = (ushort)buf[1];
    *(ushort *)((long)&pAVar3->red + lVar7) = (ushort)buf[2];
    iVar5 = (this->super_Am_Generic_Image).iminfo.num_colors;
    lVar7 = lVar7 + 6;
  }
  return 1;
}

Assistant:

int
Am_GIF_Image::load_gif_colormap(std::ifstream &ifs, int flags)
{
  //  iminfo.depth = CTSIZE(flags) + 1; set in caller
  //  iminfo.num_colors = 1 << iminfo.depth;
  iminfo.num_colors = 1 << (CTSIZE(flags) + 1);
  // if we have a color map, delete it before reallocating
  if (color_map != nullptr)
    delete[] color_map;
  color_map = new Am_RGB_Value[iminfo.num_colors];
  if (color_map == nullptr)
    return 0; // failure
  int i;
  unsigned char buf[3];
  for (i = 0; i < iminfo.num_colors; i++) {
    // ifs.read(buf, 3);  MSL
    ifs.read((char *)buf, 3);
    color_map[i].red = buf[0];
    color_map[i].green = buf[1];
    color_map[i].blue = buf[2];
  }
  return 1;
}